

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.h
# Opt level: O2

void update_cb_offsets(MACROBLOCK *x,BLOCK_SIZE bsize,int subsampling_x,int subsampling_y)

{
  BLOCK_SIZE BVar1;
  undefined7 in_register_00000031;
  ulong uVar2;
  
  uVar2 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  x->cb_offset[0] =
       x->cb_offset[0] + (ushort)block_size_high[uVar2] * (ushort)block_size_wide[uVar2];
  if ((x->e_mbd).is_chroma_ref == true) {
    BVar1 = av1_ss_size_lookup[uVar2][subsampling_x][subsampling_y];
    x->cb_offset[1] =
         x->cb_offset[1] + (ushort)block_size_high[BVar1] * (ushort)block_size_wide[BVar1];
  }
  return;
}

Assistant:

static inline void update_cb_offsets(MACROBLOCK *x, const BLOCK_SIZE bsize,
                                     const int subsampling_x,
                                     const int subsampling_y) {
  x->cb_offset[PLANE_TYPE_Y] += block_size_wide[bsize] * block_size_high[bsize];
  if (x->e_mbd.is_chroma_ref) {
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, subsampling_x, subsampling_y);
    assert(plane_bsize != BLOCK_INVALID);
    x->cb_offset[PLANE_TYPE_UV] +=
        block_size_wide[plane_bsize] * block_size_high[plane_bsize];
  }
}